

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::
TestBody(VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test *this)

{
  byte bVar1;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  this_00;
  FileDescriptor *this_01;
  bool bVar2;
  int iVar3;
  CppStringType CVar4;
  FieldDescriptor *pFVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  OneofDescriptor *pOVar7;
  Descriptor *pDVar8;
  Descriptor *pDVar9;
  FieldDescriptor *pFVar10;
  RepeatedField<bool> *pRVar11;
  RepeatedField<double> *pRVar12;
  RepeatedField<float> *pRVar13;
  RepeatedField<long> *pRVar14;
  RepeatedField<int> *pRVar15;
  RepeatedField<unsigned_long> *pRVar16;
  RepeatedPtrField<google::protobuf::Message> *pRVar17;
  RepeatedField<unsigned_int> *pRVar18;
  ExtensionSet *pEVar19;
  KeyValue *pKVar20;
  KeyValue *pKVar21;
  reference ppVar22;
  Reflection *pRVar23;
  MapDynamicFieldInfo<google::protobuf::Message> *pMVar24;
  int i;
  uint uVar25;
  ulong uVar26;
  char *message;
  ulong uVar27;
  KeyValue *pKVar28;
  Metadata MVar29;
  iterator iVar30;
  iterator iVar31;
  AssertionResult gtest_ar;
  undefined1 local_11c [20];
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  local_108;
  MapDynamicFieldInfo<google::protobuf::Message> local_f8;
  FieldDescriptor *local_c8;
  MapFieldBase *local_c0;
  uint32_t *local_b8;
  Descriptor *local_b0;
  DescriptorPool *local_a8;
  Descriptor *extendee;
  DescriptorNames local_98;
  uint32_t count;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  prefetch;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_70;
  int local_68;
  MapDynamicFieldInfo<google::protobuf::Message> local_60;
  
  this_00.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(this->super_VisitFieldsTest).message_;
  local_11c._12_4_ = 0xffffffff;
  MVar29 = Message::GetMetadata
                     ((Message *)
                      this_00.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  pRVar23 = MVar29.reflection;
  if ((pRVar23->schema_).weak_field_map_offset_ < 1) {
    uVar27 = 0;
    local_c8 = (FieldDescriptor *)this;
    if ((pRVar23->schema_).has_bits_offset_ == -1) {
      local_b8 = (uint32_t *)0x0;
    }
    else {
      local_b8 = Reflection::GetHasBits
                           (pRVar23,(Message *)
                                    this_00.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl);
    }
    local_b0 = pRVar23->descriptor_;
    local_c0 = (MapFieldBase *)(pRVar23->schema_).has_bit_indices_;
    uVar26 = (ulong)(uint)local_b0->field_count_;
    if (local_b0->field_count_ < 1) {
      uVar26 = uVar27;
    }
    for (; pFVar5 = local_c8, uVar26 != uVar27; uVar27 = uVar27 + 1) {
      pFVar5 = Descriptor::field(local_b0,(int)uVar27);
      if ((pFVar5->options_->field_0)._impl_.weak_ == true) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&gtest_ar,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,0x6e,"!field->options().weak()");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&gtest_ar,(char (*) [30])"weak fields are not supported");
        goto LAB_0072bc3c;
      }
      if ((local_11c._12_4_ != 0xffffffff) &&
         (((uint)local_11c._12_4_ >>
           (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar5->type_ * 4) & 0x1f) & 1) ==
          0)) goto LAB_0072acbc;
      bVar2 = FieldDescriptor::is_repeated(pFVar5);
      if (bVar2) {
        switch(pFVar5->type_) {
        case '\x01':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (bVar2) {
            pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
            goto LAB_0072b913;
          }
          pRVar12 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                              (pRVar23,(Message *)
                                       this_00.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,pFVar5);
          iVar3 = RepeatedField<double>::size(pRVar12);
          if (iVar3 != 0) {
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double> *)
                       &gtest_ar);
          }
          break;
        case '\x02':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (bVar2) {
            pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
            goto LAB_0072b833;
          }
          pRVar13 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                              (pRVar23,(Message *)
                                       this_00.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,pFVar5);
          iVar3 = RepeatedField<float>::size(pRVar13);
          if (iVar3 != 0) {
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float> *)
                       &gtest_ar);
          }
          break;
        case '\x03':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (!bVar2) goto LAB_0072a8a4;
          pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
          goto LAB_0072b94b;
        case '\x04':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (!bVar2) goto LAB_0072a94c;
          pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
          goto LAB_0072b985;
        case '\x05':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (!bVar2) goto LAB_0072a8f8;
          pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
          goto LAB_0072b853;
        case '\x06':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (bVar2) {
            pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
            goto LAB_0072b968;
          }
LAB_0072a94c:
          pRVar16 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                              (pRVar23,(Message *)
                                       this_00.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,pFVar5);
          iVar3 = RepeatedField<unsigned_long>::size(pRVar16);
          if (iVar3 != 0) {
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                        *)&gtest_ar);
          }
          break;
        case '\a':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (!bVar2) goto LAB_0072a9eb;
          pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
          goto LAB_0072b92e;
        case '\b':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (bVar2) {
            pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
            goto LAB_0072b813;
          }
          pRVar11 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                              (pRVar23,(Message *)
                                       this_00.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,pFVar5);
          iVar3 = RepeatedField<bool>::size(pRVar11);
          if (iVar3 != 0) {
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool> *)
                       &gtest_ar);
          }
          break;
        case '\t':
        case '\f':
          CVar4 = FieldDescriptor::cpp_string_type(pFVar5);
          if ((CVar4 - kView < 3) &&
             (pRVar6 = Reflection::
                       GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                                 (pRVar23,(Message *)
                                          this_00.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,pFVar5),
             (pRVar6->super_RepeatedPtrFieldBase).current_size_ != 0)) {
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Clear((RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
          }
          break;
        case '\n':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (bVar2) {
            pDVar8 = (Descriptor *)
                     Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                               (pRVar23,(Message *)
                                        this_00.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl,pFVar5);
            iVar3 = MapFieldBase::size((MapFieldBase *)pDVar8);
            if (iVar3 != 0) {
              pDVar9 = FieldDescriptor::message_type(pFVar5);
              local_11c._4_8_ = pDVar8;
              local_98.payload_ = (char *)Descriptor::map_key(pDVar9);
              pFVar10 = Descriptor::map_value(pDVar9);
              MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                        (&local_f8,pRVar23,
                         (Message *)
                         this_00.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,pFVar5,(FieldDescriptor *)local_98.payload_,pFVar10,
                         (MapFieldBase *)local_11c._4_8_);
              gtest_ar._0_4_ = (int)local_f8.reflection;
              gtest_ar._4_4_ = local_f8.reflection._4_4_;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ = (int)local_f8.message;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = local_f8.message._4_4_;
LAB_0072ad6d:
              MapDynamicFieldInfo<google::protobuf::Message>::Clear
                        ((MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar);
            }
          }
          else {
LAB_0072a9a9:
            pRVar17 = Reflection::
                      GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                (pRVar23,(Message *)
                                         this_00.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl,pFVar5);
            if ((pRVar17->super_RepeatedPtrFieldBase).current_size_ != 0) {
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
              ::Clear((RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
                       *)&gtest_ar);
            }
          }
          break;
        case '\v':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (!bVar2) goto LAB_0072a9a9;
          pDVar8 = (Descriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                             (pRVar23,(Message *)
                                      this_00.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl,pFVar5);
          iVar3 = MapFieldBase::size((MapFieldBase *)pDVar8);
          if (iVar3 != 0) {
            pDVar9 = FieldDescriptor::message_type(pFVar5);
            local_11c._4_8_ = pDVar8;
            local_98.payload_ = (char *)Descriptor::map_key(pDVar9);
            pFVar10 = Descriptor::map_value(pDVar9);
            MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                      (&local_60,pRVar23,
                       (Message *)
                       this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,pFVar5,(FieldDescriptor *)local_98.payload_,pFVar10,
                       (MapFieldBase *)local_11c._4_8_);
            gtest_ar._0_4_ = (int)local_60.reflection;
            gtest_ar._4_4_ = local_60.reflection._4_4_;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_4_ = local_60.message._0_4_;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = local_60.message._4_4_;
            goto LAB_0072ad6d;
          }
          break;
        case '\r':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (bVar2) {
            pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
            goto LAB_0072b8f3;
          }
LAB_0072a9eb:
          pRVar18 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                              (pRVar23,(Message *)
                                       this_00.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,pFVar5);
          iVar3 = RepeatedField<unsigned_int>::size(pRVar18);
          if (iVar3 != 0) {
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                        *)&gtest_ar);
          }
          break;
        case '\x0e':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (!bVar2) goto LAB_0072a8f8;
          pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
          goto LAB_0072b8b3;
        case '\x0f':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (!bVar2) goto LAB_0072a8f8;
          pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
          goto LAB_0072b7f3;
        case '\x10':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (!bVar2) goto LAB_0072a8a4;
          pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
          goto LAB_0072b893;
        case '\x11':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (bVar2) {
            pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
            goto LAB_0072b873;
          }
LAB_0072a8f8:
          pRVar15 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                              (pRVar23,(Message *)
                                       this_00.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,pFVar5);
          iVar3 = RepeatedField<int>::size(pRVar15);
          if (iVar3 != 0) {
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int> *)
                       &gtest_ar);
          }
          break;
        case '\x12':
          bVar2 = FieldDescriptor::is_map(pFVar5);
          if (bVar2) {
            pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
            goto LAB_0072b8d3;
          }
LAB_0072a8a4:
          pRVar14 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                              (pRVar23,(Message *)
                                       this_00.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,pFVar5);
          iVar3 = RepeatedField<long>::size(pRVar14);
          if (iVar3 != 0) {
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long> *)
                       &gtest_ar);
          }
          break;
        default:
          goto switchD_0072a520_default;
        }
      }
      else {
        pOVar7 = FieldDescriptor::real_containing_oneof(pFVar5);
        if (pOVar7 == (OneofDescriptor *)0x0) {
          if ((local_b8 == (uint32_t *)0x0) ||
             (uVar25 = *(uint *)((long)&(local_c0->super_MapFieldBaseForParse).payload_._M_i +
                                uVar27 * 4), uVar25 == 0xffffffff)) {
            bVar2 = Reflection::HasFieldSingular
                              (pRVar23,(Message *)
                                       this_00.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,pFVar5);
            if (bVar2) goto LAB_0072a628;
          }
          else if ((local_b8[uVar25 >> 5] >> (uVar25 & 0x1f) & 1) != 0) {
LAB_0072a628:
            switch(pFVar5->type_) {
            case '\x01':
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_false>
              ::Clear((SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_false>
                       *)&gtest_ar);
              break;
            case '\x02':
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_false>
              ::Clear((SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_false>
                       *)&gtest_ar);
              break;
            case '\x03':
            case '\x10':
            case '\x12':
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
              ::Clear((SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_false>
                       *)&gtest_ar);
              break;
            case '\x04':
            case '\x06':
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
              ::Clear((SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_false>
                       *)&gtest_ar);
              break;
            case '\x05':
            case '\x0f':
            case '\x11':
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
              ::Clear((SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_false>
                       *)&gtest_ar);
              break;
            case '\a':
            case '\r':
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
              ::Clear((SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_false>
                       *)&gtest_ar);
              break;
            case '\b':
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_false>
              ::Clear((SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_false>
                       *)&gtest_ar);
              break;
            case '\t':
            case '\f':
              CVar4 = FieldDescriptor::cpp_string_type(pFVar5);
              if ((CVar4 == kView) || (CVar4 == kString)) {
                gtest_ar._0_8_ = pRVar23;
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )this_00.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
                StringDynamicFieldInfo<google::protobuf::Message,_false>::Clear
                          ((StringDynamicFieldInfo<google::protobuf::Message,_false> *)&gtest_ar);
              }
              else if (CVar4 == kCord) {
                gtest_ar._0_8_ = pRVar23;
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )this_00.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
                CordDynamicFieldInfo<google::protobuf::Message,_false>::Clear
                          ((CordDynamicFieldInfo<google::protobuf::Message,_false> *)&gtest_ar);
              }
              break;
            case '\n':
            case '\v':
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              MessageDynamicFieldInfo<google::protobuf::Message,_false>::Clear
                        ((MessageDynamicFieldInfo<google::protobuf::Message,_false> *)&gtest_ar);
              break;
            case '\x0e':
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              EnumDynamicFieldInfo<google::protobuf::Message,_false>::Clear
                        ((EnumDynamicFieldInfo<google::protobuf::Message,_false> *)&gtest_ar);
              break;
            default:
              goto switchD_0072a645_default;
            }
          }
        }
        else {
          pOVar7 = FieldDescriptor::containing_oneof(pFVar5);
          if ((ulong)*(uint *)((ulong)(uint)(pRVar23->schema_).oneof_case_offset_ +
                               (long)this_00.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl +
                              (long)(int)(((long)pOVar7 -
                                          (long)pOVar7->containing_type_->oneof_decls_) / 0x38) * 4)
              != (long)pFVar5->number_) goto LAB_0072acbc;
          switch(pFVar5->type_) {
          case '\x01':
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_true>
            ::Clear((SingularPrimitive<google::protobuf::Message,_double,_(google::protobuf::internal::FieldDescriptorLite::CppType)5,_true>
                     *)&gtest_ar);
            break;
          case '\x02':
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_true>
            ::Clear((SingularPrimitive<google::protobuf::Message,_float,_(google::protobuf::internal::FieldDescriptorLite::CppType)6,_true>
                     *)&gtest_ar);
            break;
          case '\x03':
          case '\x10':
          case '\x12':
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
            ::Clear((SingularPrimitive<google::protobuf::Message,_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)2,_true>
                     *)&gtest_ar);
            break;
          case '\x04':
          case '\x06':
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
            ::Clear((SingularPrimitive<google::protobuf::Message,_unsigned_long,_(google::protobuf::internal::FieldDescriptorLite::CppType)4,_true>
                     *)&gtest_ar);
            break;
          case '\x05':
          case '\x0f':
          case '\x11':
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
            ::Clear((SingularPrimitive<google::protobuf::Message,_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)1,_true>
                     *)&gtest_ar);
            break;
          case '\a':
          case '\r':
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
            ::Clear((SingularPrimitive<google::protobuf::Message,_unsigned_int,_(google::protobuf::internal::FieldDescriptorLite::CppType)3,_true>
                     *)&gtest_ar);
            break;
          case '\b':
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_true>
            ::Clear((SingularPrimitive<google::protobuf::Message,_bool,_(google::protobuf::internal::FieldDescriptorLite::CppType)7,_true>
                     *)&gtest_ar);
            break;
          case '\t':
          case '\f':
            CVar4 = FieldDescriptor::cpp_string_type(pFVar5);
            if ((CVar4 == kView) || (CVar4 == kString)) {
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              StringDynamicFieldInfo<google::protobuf::Message,_true>::Clear
                        ((StringDynamicFieldInfo<google::protobuf::Message,_true> *)&gtest_ar);
            }
            else if (CVar4 == kCord) {
              gtest_ar._0_8_ = pRVar23;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )this_00.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              CordDynamicFieldInfo<google::protobuf::Message,_true>::Clear
                        ((CordDynamicFieldInfo<google::protobuf::Message,_true> *)&gtest_ar);
            }
            break;
          case '\n':
          case '\v':
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            MessageDynamicFieldInfo<google::protobuf::Message,_true>::Clear
                      ((MessageDynamicFieldInfo<google::protobuf::Message,_true> *)&gtest_ar);
            break;
          case '\x0e':
            gtest_ar._0_8_ = pRVar23;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )this_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            EnumDynamicFieldInfo<google::protobuf::Message,_true>::Clear
                      ((EnumDynamicFieldInfo<google::protobuf::Message,_true> *)&gtest_ar);
            break;
          default:
            goto switchD_0072a5cb_default;
          }
        }
      }
LAB_0072acbc:
    }
    if ((pRVar23->schema_).extensions_offset_ != -1) {
      pEVar19 = Reflection::MutableExtensionSet
                          (pRVar23,(Message *)
                                   this_00.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
      extendee = pRVar23->descriptor_;
      local_a8 = pRVar23->descriptor_pool_;
      if ((short)pEVar19->flat_size_ < 0) {
        iVar30 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                 ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                          *)(pEVar19->map_).flat);
        iVar31 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                 ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                        *)(pEVar19->map_).flat);
        local_70 = (anon_union_8_2_3066aaf9_for_type_descriptor_)iVar31.node_;
        gtest_ar._0_8_ = local_11c + 0xc;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )local_11c;
        local_68 = iVar31.position_;
        prefetch._12_4_ = local_108._12_4_;
        local_108.node_ =
             (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              *)iVar30.node_;
        local_108.position_ = iVar30.position_;
        prefetch.node_ =
             (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              *)iVar30.node_;
        prefetch.position_ = iVar30.position_;
        for (uVar25 = 0;
            (bVar2 = absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                     ::operator!=(&prefetch,(iterator *)&local_70), bVar2 && (uVar25 < 0x10));
            uVar25 = uVar25 + 1) {
          ppVar22 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&prefetch);
          ExtensionSet::Extension::PrefetchPtr(&ppVar22->second);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::increment(&prefetch);
        }
        while( true ) {
          bVar2 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                  ::operator!=(&prefetch,(iterator *)&local_70);
          if (!bVar2) break;
          ppVar22 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_108);
          iVar3 = ppVar22->first;
          ppVar22 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_108);
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&gtest_ar,iVar3,&ppVar22->second);
          ppVar22 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&prefetch);
          ExtensionSet::Extension::PrefetchPtr(&ppVar22->second);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::increment(&local_108);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::increment(&prefetch);
        }
        while (bVar2 = absl::lts_20250127::container_internal::
                       btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                       ::operator!=(&local_108,(iterator *)&local_70), bVar2) {
          ppVar22 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_108);
          iVar3 = ppVar22->first;
          ppVar22 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_108);
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&gtest_ar,iVar3,&ppVar22->second);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::increment(&local_108);
        }
      }
      else {
        pKVar20 = ExtensionSet::flat_begin(pEVar19);
        pKVar21 = ExtensionSet::flat_end(pEVar19);
        gtest_ar._0_8_ = local_11c + 0xc;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )local_11c;
        pKVar28 = pKVar20;
        for (uVar25 = 0; (pKVar28 != pKVar21 && (uVar25 < 0x10)); uVar25 = uVar25 + 1) {
          ExtensionSet::Extension::PrefetchPtr(&pKVar28->second);
          pKVar28 = pKVar28 + 1;
        }
        for (; pKVar28 != pKVar21; pKVar28 = pKVar28 + 1) {
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&gtest_ar,pKVar20->first,&pKVar20->second);
          ExtensionSet::Extension::PrefetchPtr(&pKVar28->second);
          pKVar20 = pKVar20 + 1;
        }
        for (; pKVar20 != pKVar21; pKVar20 = pKVar20 + 1) {
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&gtest_ar,pKVar20->first,&pKVar20->second);
        }
      }
    }
    local_11c._12_8_ = &count;
    count = 0;
    this_01 = pFVar5[2].file_;
    local_11c._0_4_ = 0xffffffff;
    MVar29 = Message::GetMetadata((Message *)this_01);
    pRVar23 = MVar29.reflection;
    if ((pRVar23->schema_).weak_field_map_offset_ < 1) {
      uVar27 = 0;
      if ((pRVar23->schema_).has_bits_offset_ == -1) {
        local_b0 = (Descriptor *)0x0;
      }
      else {
        local_b0 = (Descriptor *)Reflection::GetHasBits(pRVar23,(Message *)this_01);
      }
      pDVar8 = pRVar23->descriptor_;
      local_b8 = (pRVar23->schema_).has_bit_indices_;
      uVar25 = pDVar8->field_count_;
      uVar26 = (ulong)uVar25;
      if ((int)uVar25 < 1) {
        uVar26 = uVar27;
      }
      do {
        if (uVar26 == uVar27) {
          if ((pRVar23->schema_).extensions_offset_ != -1) {
            pEVar19 = Reflection::MutableExtensionSet(pRVar23,(Message *)this_01);
            extendee = pRVar23->descriptor_;
            local_a8 = pRVar23->descriptor_pool_;
            if ((short)pEVar19->flat_size_ < 0) {
              iVar30 = absl::lts_20250127::container_internal::
                       btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                       ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                                *)(pEVar19->map_).flat);
              iVar31 = absl::lts_20250127::container_internal::
                       btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                       ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                              *)(pEVar19->map_).flat);
              local_70 = (anon_union_8_2_3066aaf9_for_type_descriptor_)iVar31.node_;
              local_f8.reflection = (Reflection *)local_11c;
              local_f8.message = (Message *)(local_11c + 0xc);
              local_f8.field = (FieldDescriptor *)&local_a8;
              local_f8.key = (FieldDescriptor *)&extendee;
              local_68 = iVar31.position_;
              prefetch._12_4_ = local_108._12_4_;
              local_108.node_ =
                   (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                    *)iVar30.node_;
              local_108.position_ = iVar30.position_;
              prefetch.node_ =
                   (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                    *)iVar30.node_;
              prefetch.position_ = iVar30.position_;
              for (uVar25 = 0;
                  (bVar2 = absl::lts_20250127::container_internal::
                           btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                           ::operator!=(&prefetch,(iterator *)&local_70), bVar2 && (uVar25 < 0x10));
                  uVar25 = uVar25 + 1) {
                ppVar22 = absl::lts_20250127::container_internal::
                          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                          ::operator*(&prefetch);
                ExtensionSet::Extension::PrefetchPtr(&ppVar22->second);
                absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                ::increment(&prefetch);
              }
              while( true ) {
                bVar2 = absl::lts_20250127::container_internal::
                        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                        ::operator!=(&prefetch,(iterator *)&local_70);
                if (!bVar2) break;
                ppVar22 = absl::lts_20250127::container_internal::
                          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                          ::operator*(&local_108);
                iVar3 = ppVar22->first;
                ppVar22 = absl::lts_20250127::container_internal::
                          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                          ::operator*(&local_108);
                ReflectionVisit::
                VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1&&,google::protobuf::internal::FieldMask)
                ::{lambda(int,auto:1&)#1}::operator()(&local_f8,iVar3,&ppVar22->second);
                ppVar22 = absl::lts_20250127::container_internal::
                          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                          ::operator*(&prefetch);
                ExtensionSet::Extension::PrefetchPtr(&ppVar22->second);
                absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                ::increment(&local_108);
                absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                ::increment(&prefetch);
              }
              while (bVar2 = absl::lts_20250127::container_internal::
                             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                             ::operator!=(&local_108,(iterator *)&local_70), bVar2) {
                ppVar22 = absl::lts_20250127::container_internal::
                          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                          ::operator*(&local_108);
                iVar3 = ppVar22->first;
                ppVar22 = absl::lts_20250127::container_internal::
                          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                          ::operator*(&local_108);
                ReflectionVisit::
                VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1&&,google::protobuf::internal::FieldMask)
                ::{lambda(int,auto:1&)#1}::operator()(&local_f8,iVar3,&ppVar22->second);
                absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                ::increment(&local_108);
              }
            }
            else {
              pKVar20 = ExtensionSet::flat_begin(pEVar19);
              pKVar21 = ExtensionSet::flat_end(pEVar19);
              local_f8.reflection = (Reflection *)local_11c;
              local_f8.message = (Message *)(local_11c + 0xc);
              local_f8.field = (FieldDescriptor *)&local_a8;
              local_f8.key = (FieldDescriptor *)&extendee;
              pKVar28 = pKVar20;
              for (uVar25 = 0; (pKVar28 != pKVar21 && (uVar25 < 0x10)); uVar25 = uVar25 + 1) {
                ExtensionSet::Extension::PrefetchPtr(&pKVar28->second);
                pKVar28 = pKVar28 + 1;
              }
              for (; pKVar28 != pKVar21; pKVar28 = pKVar28 + 1) {
                ReflectionVisit::
                VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1&&,google::protobuf::internal::FieldMask)
                ::{lambda(int,auto:1&)#1}::operator()(&local_f8,pKVar20->first,&pKVar20->second);
                ExtensionSet::Extension::PrefetchPtr(&pKVar28->second);
                pKVar20 = pKVar20 + 1;
              }
              for (; pKVar20 != pKVar21; pKVar20 = pKVar20 + 1) {
                ReflectionVisit::
                VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1&&,google::protobuf::internal::FieldMask)
                ::{lambda(int,auto:1&)#1}::operator()(&local_f8,pKVar20->first,&pKVar20->second);
              }
            }
          }
          local_60.reflection._0_4_ = 0;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&gtest_ar,"count","0",&count,(int *)&local_60);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_60);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              message = anon_var_dwarf_651463 + 5;
            }
            else {
              message = *(char **)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
                       ,0x88,message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_f8,(Message *)&local_60);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
            if ((long *)CONCAT44(local_60.reflection._4_4_,(int)local_60.reflection) != (long *)0x0)
            {
              (**(code **)(*(long *)CONCAT44(local_60.reflection._4_4_,(int)local_60.reflection) + 8
                          ))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          return;
        }
        pFVar5 = Descriptor::field(pDVar8,(int)uVar27);
        if ((pFVar5->options_->field_0)._impl_.weak_ == true) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x6e,"!field->options().weak()");
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    ((LogMessage *)&local_f8,(char (*) [30])"weak fields are not supported");
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_f8);
        }
        if ((local_11c._0_4_ != 0xffffffff) &&
           (((uint)local_11c._0_4_ >>
             (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar5->type_ * 4) & 0x1f) & 1)
            == 0)) goto LAB_0072b5d4;
        bVar2 = FieldDescriptor::is_repeated(pFVar5);
        if (bVar2) {
          switch(pFVar5->type_) {
          case '\x01':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b913:
              iVar3 = 0x7f;
LAB_0072b98d:
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)pMVar24,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                         ,iVar3,"!field->is_map()");
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)pMVar24);
            }
            pRVar12 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                                (pRVar23,(Message *)this_01,pFVar5);
            iVar3 = RepeatedField<double>::size(pRVar12);
            break;
          case '\x02':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b833:
              iVar3 = 0x80;
              goto LAB_0072b98d;
            }
            pRVar13 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                                (pRVar23,(Message *)this_01,pFVar5);
            iVar3 = RepeatedField<float>::size(pRVar13);
            break;
          case '\x03':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b94b:
              iVar3 = 0x81;
              goto LAB_0072b98d;
            }
            goto LAB_0072b512;
          case '\x04':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b985:
              iVar3 = 0x82;
              goto LAB_0072b98d;
            }
            goto LAB_0072b565;
          case '\x05':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b853:
              iVar3 = 0x83;
              goto LAB_0072b98d;
            }
            goto LAB_0072b53d;
          case '\x06':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b968:
              iVar3 = 0x84;
              goto LAB_0072b98d;
            }
LAB_0072b565:
            pRVar16 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                                (pRVar23,(Message *)this_01,pFVar5);
            iVar3 = RepeatedField<unsigned_long>::size(pRVar16);
            break;
          case '\a':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b92e:
              iVar3 = 0x85;
              goto LAB_0072b98d;
            }
            goto LAB_0072b5b3;
          case '\b':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b813:
              iVar3 = 0x86;
              goto LAB_0072b98d;
            }
            pRVar11 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                                (pRVar23,(Message *)this_01,pFVar5);
            iVar3 = RepeatedField<bool>::size(pRVar11);
            break;
          case '\t':
          case '\f':
            CVar4 = FieldDescriptor::cpp_string_type(pFVar5);
            if (CVar4 - kView < 3) {
              pRVar6 = Reflection::
                       GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                                 (pRVar23,(Message *)this_01,pFVar5);
LAB_0072b59b:
              iVar3 = (pRVar6->super_RepeatedPtrFieldBase).current_size_;
              break;
            }
            goto LAB_0072b5d4;
          case '\n':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (!bVar2) {
LAB_0072b58d:
              pRVar6 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)Reflection::
                          GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                    (pRVar23,(Message *)this_01,pFVar5);
              goto LAB_0072b59b;
            }
            local_c0 = Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                                 (pRVar23,(Message *)this_01,pFVar5);
            iVar3 = MapFieldBase::size(local_c0);
            if (iVar3 == 0) goto LAB_0072b5d4;
            local_11c._4_8_ = FieldDescriptor::message_type(pFVar5);
            local_c8 = Descriptor::map_key((Descriptor *)local_11c._4_8_);
            pFVar10 = Descriptor::map_value((Descriptor *)local_11c._4_8_);
            pMVar24 = &local_60;
LAB_0072b66a:
            MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                      (pMVar24,pRVar23,(Message *)this_01,pFVar5,local_c8,pFVar10,local_c0);
            goto LAB_0072b5cd;
          case '\v':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (!bVar2) goto LAB_0072b58d;
            local_c0 = Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                                 (pRVar23,(Message *)this_01,pFVar5);
            iVar3 = MapFieldBase::size(local_c0);
            if (iVar3 != 0) {
              local_11c._4_8_ = FieldDescriptor::message_type(pFVar5);
              local_c8 = Descriptor::map_key((Descriptor *)local_11c._4_8_);
              pFVar10 = Descriptor::map_value((Descriptor *)local_11c._4_8_);
              pMVar24 = (MapDynamicFieldInfo<google::protobuf::Message> *)&gtest_ar;
              goto LAB_0072b66a;
            }
            goto LAB_0072b5d4;
          case '\r':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b8f3:
              iVar3 = 0x87;
              goto LAB_0072b98d;
            }
LAB_0072b5b3:
            pRVar18 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                                (pRVar23,(Message *)this_01,pFVar5);
            iVar3 = RepeatedField<unsigned_int>::size(pRVar18);
            break;
          case '\x0e':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b8b3:
              iVar3 = 0x88;
              goto LAB_0072b98d;
            }
            goto LAB_0072b53d;
          case '\x0f':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b7f3:
              iVar3 = 0x89;
              goto LAB_0072b98d;
            }
            goto LAB_0072b53d;
          case '\x10':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b893:
              iVar3 = 0x8a;
              goto LAB_0072b98d;
            }
            goto LAB_0072b512;
          case '\x11':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b873:
              iVar3 = 0x8b;
              goto LAB_0072b98d;
            }
LAB_0072b53d:
            pRVar15 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                                (pRVar23,(Message *)this_01,pFVar5);
            iVar3 = RepeatedField<int>::size(pRVar15);
            break;
          case '\x12':
            bVar2 = FieldDescriptor::is_map(pFVar5);
            if (bVar2) {
              pMVar24 = &local_f8;
LAB_0072b8d3:
              iVar3 = 0x8c;
              goto LAB_0072b98d;
            }
LAB_0072b512:
            pRVar14 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                                (pRVar23,(Message *)this_01,pFVar5);
            iVar3 = RepeatedField<long>::size(pRVar14);
            break;
          default:
switchD_0072a520_default:
            Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                        ,0xbb);
          }
          if (iVar3 != 0) {
LAB_0072b5cd:
            *(uint32_t *)local_11c._12_8_ = *(uint32_t *)local_11c._12_8_ + 1;
          }
        }
        else {
          pOVar7 = FieldDescriptor::real_containing_oneof(pFVar5);
          if (pOVar7 == (OneofDescriptor *)0x0) {
            if ((local_b0 == (Descriptor *)0x0) || (uVar25 = local_b8[uVar27], uVar25 == 0xffffffff)
               ) {
              bVar2 = Reflection::HasFieldSingular(pRVar23,(Message *)this_01,pFVar5);
              if (bVar2) goto LAB_0072b33a;
            }
            else if ((*(uint *)(&local_b0->super_SymbolBase + (ulong)(uVar25 >> 5) * 4) >>
                      (uVar25 & 0x1f) & 1) != 0) {
LAB_0072b33a:
              bVar1 = pFVar5->type_;
              if (bVar1 < 0x13) {
                if ((0x7edfeU >> (bVar1 & 0x1f) & 1) != 0) goto LAB_0072b5cd;
                if ((0x1200U >> (bVar1 & 0x1f) & 1) != 0) goto LAB_0072b363;
              }
switchD_0072a645_default:
              Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                          ,0x12d);
            }
            goto LAB_0072b5d4;
          }
          pOVar7 = FieldDescriptor::containing_oneof(pFVar5);
          if ((ulong)*(uint *)((long)&((MessageLite *)&this_01->super_SymbolBase)->_vptr_MessageLite
                              + (long)(int)(((long)pOVar7 -
                                            (long)pOVar7->containing_type_->oneof_decls_) / 0x38) *
                                4 + (ulong)(uint)(pRVar23->schema_).oneof_case_offset_) !=
              (long)pFVar5->number_) goto LAB_0072b5d4;
          bVar1 = pFVar5->type_;
          if (0x12 < bVar1) {
switchD_0072a5cb_default:
            Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                        ,0xf6);
          }
          if ((0x7edfeU >> (bVar1 & 0x1f) & 1) != 0) goto LAB_0072b5cd;
          if ((0x1200U >> (bVar1 & 0x1f) & 1) == 0) goto switchD_0072a5cb_default;
LAB_0072b363:
          CVar4 = FieldDescriptor::cpp_string_type(pFVar5);
          if (CVar4 - kView < 3) goto LAB_0072b5cd;
        }
LAB_0072b5d4:
        uVar27 = uVar27 + 1;
      } while( true );
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&gtest_ar,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&gtest_ar,(char (*) [30])"weak fields are not supported");
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&gtest_ar,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&gtest_ar,(char (*) [30])"weak fields are not supported");
  }
LAB_0072bc3c:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&gtest_ar);
}

Assistant:

TEST_P(VisitFieldsTest, ClearByVisitFieldsRevisitNone) {
  VisitFields(*message_, [](auto info) { info.Clear(); });

  uint32_t count = 0;
  VisitFields(*message_, [&](auto info) { ++count; });

  EXPECT_EQ(count, 0);
}